

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batchnorm_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::BatchNorm_x86_fma::forward_inplace(BatchNorm_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  void *pvVar8;
  _func_int **pp_Var9;
  size_t sVar10;
  size_t sVar11;
  undefined1 auVar12 [16];
  int iVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  long lVar19;
  int iVar20;
  long lVar21;
  undefined1 (*pauVar22) [32];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  
  iVar3 = bottom_top_blob->elempack;
  iVar20 = bottom_top_blob->dims;
  iVar4 = bottom_top_blob->w;
  uVar5 = bottom_top_blob->h;
  iVar13 = bottom_top_blob->d;
  uVar6 = bottom_top_blob->c;
  if (iVar20 == 2) {
    iVar14 = iVar3 * iVar4;
    pp_Var9 = this->_vptr_BatchNorm_x86_fma;
    uVar17 = 0;
    uVar16 = 0;
    if (0 < (int)uVar5) {
      uVar16 = (ulong)uVar5;
    }
    for (; uVar17 != uVar16; uVar17 = uVar17 + 1) {
      lVar19 = *(long *)(&this->field_0x1f8 + (long)pp_Var9[-3]);
      lVar15 = *(long *)(&this->field_0x240 + (long)pp_Var9[-3]);
      uVar1 = *(uint *)(lVar19 + uVar17 * 4);
      uVar2 = *(uint *)(lVar15 + uVar17 * 4);
      auVar23 = ZEXT416(uVar1);
      if (iVar3 == 4) {
        auVar25 = *(undefined1 (*) [16])(lVar19 + uVar17 * 0x10);
        auVar27._16_16_ = auVar25;
        auVar27._0_16_ = auVar25;
        auVar24 = *(undefined1 (*) [16])(lVar15 + uVar17 * 0x10);
LAB_0018bf25:
        auVar29._16_16_ = auVar24;
        auVar29._0_16_ = auVar24;
      }
      else {
        auVar25 = vshufps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0);
        auVar24 = vshufps_avx(ZEXT416(uVar2),ZEXT416(uVar2),0);
        if (iVar3 != 8) {
          auVar12 = vshufps_avx(auVar23,auVar23,0);
          auVar27._16_16_ = auVar12;
          auVar27._0_16_ = auVar12;
          goto LAB_0018bf25;
        }
        auVar27 = *(undefined1 (*) [32])(lVar19 + uVar17 * 0x20);
        auVar29 = *(undefined1 (*) [32])(lVar15 + uVar17 * 0x20);
      }
      iVar7 = bottom_top_blob->w;
      pvVar8 = bottom_top_blob->data;
      sVar10 = bottom_top_blob->elemsize;
      pauVar22 = (undefined1 (*) [32])(uVar17 * (long)iVar7 * sVar10 + (long)pvVar8);
      lVar19 = 0;
      for (iVar18 = 0; iVar18 + 7 < iVar14; iVar18 = iVar18 + 8) {
        auVar12 = vfmadd132ps_fma(*pauVar22,auVar27,auVar29);
        *pauVar22 = ZEXT1632(auVar12);
        pauVar22 = pauVar22 + 1;
        lVar19 = lVar19 + 8;
      }
      for (; iVar18 + 3 < iVar14; iVar18 = iVar18 + 4) {
        auVar12 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar22,auVar25,auVar24);
        *(undefined1 (*) [16])*pauVar22 = auVar12;
        pauVar22 = (undefined1 (*) [32])(*pauVar22 + 0x10);
        lVar19 = lVar19 + 4;
      }
      lVar15 = sVar10 * uVar17 * (long)iVar7;
      for (; (int)lVar19 < iVar14; lVar19 = lVar19 + 1) {
        auVar25 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)pvVar8 + lVar19 * 4 + lVar15)),auVar23,
                                  ZEXT416(uVar2));
        *(int *)((long)pvVar8 + lVar19 * 4 + lVar15) = auVar25._0_4_;
      }
    }
  }
  else if (iVar20 == 1) {
    pvVar8 = bottom_top_blob->data;
    lVar19 = *(long *)(&this->field_0x1f8 + (long)this->_vptr_BatchNorm_x86_fma[-3]);
    lVar15 = *(long *)(&this->field_0x240 + (long)this->_vptr_BatchNorm_x86_fma[-3]);
    iVar14 = iVar3 * iVar4;
    for (lVar21 = 0; (int)lVar21 + 7 < iVar14; lVar21 = lVar21 + 8) {
      auVar23 = vfmadd213ps_fma(*(undefined1 (*) [32])(lVar15 + lVar21 * 4),
                                *(undefined1 (*) [32])((long)pvVar8 + lVar21 * 4),
                                *(undefined1 (*) [32])(lVar19 + lVar21 * 4));
      *(undefined1 (*) [32])((long)pvVar8 + lVar21 * 4) = ZEXT1632(auVar23);
    }
    for (; (int)lVar21 + 3 < iVar14; lVar21 = lVar21 + 4) {
      auVar23 = vfmadd213ps_fma(*(undefined1 (*) [16])(lVar15 + lVar21 * 4),
                                *(undefined1 (*) [16])((long)pvVar8 + lVar21 * 4),
                                *(undefined1 (*) [16])(lVar19 + lVar21 * 4));
      *(undefined1 (*) [16])((long)pvVar8 + lVar21 * 4) = auVar23;
    }
    for (; (int)lVar21 < iVar14; lVar21 = lVar21 + 1) {
      auVar23 = vfmadd213ss_fma(ZEXT416(*(uint *)((long)pvVar8 + lVar21 * 4)),
                                ZEXT416(*(uint *)(lVar15 + lVar21 * 4)),
                                ZEXT416(*(uint *)(lVar19 + lVar21 * 4)));
      *(int *)((long)pvVar8 + lVar21 * 4) = auVar23._0_4_;
    }
  }
  if (iVar20 - 3U < 2) {
    iVar13 = iVar4 * iVar3 * uVar5 * iVar13;
    pp_Var9 = this->_vptr_BatchNorm_x86_fma;
    uVar16 = 0;
    uVar17 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      uVar17 = uVar16;
    }
    for (; uVar16 != uVar17; uVar16 = uVar16 + 1) {
      lVar19 = *(long *)(&this->field_0x1f8 + (long)pp_Var9[-3]);
      lVar15 = *(long *)(&this->field_0x240 + (long)pp_Var9[-3]);
      uVar5 = *(uint *)(lVar19 + uVar16 * 4);
      uVar6 = *(uint *)(lVar15 + uVar16 * 4);
      auVar23 = ZEXT416(uVar5);
      if (iVar3 == 4) {
        auVar25 = *(undefined1 (*) [16])(lVar19 + uVar16 * 0x10);
        auVar26._16_16_ = auVar25;
        auVar26._0_16_ = auVar25;
        auVar24 = *(undefined1 (*) [16])(lVar15 + uVar16 * 0x10);
LAB_0018bde8:
        auVar28._16_16_ = auVar24;
        auVar28._0_16_ = auVar24;
      }
      else {
        auVar25 = vshufps_avx(ZEXT416(uVar5),ZEXT416(uVar5),0);
        auVar24 = vshufps_avx(ZEXT416(uVar6),ZEXT416(uVar6),0);
        if (iVar3 != 8) {
          auVar12 = vshufps_avx(auVar23,auVar23,0);
          auVar26._16_16_ = auVar12;
          auVar26._0_16_ = auVar12;
          goto LAB_0018bde8;
        }
        auVar26 = *(undefined1 (*) [32])(lVar19 + uVar16 * 0x20);
        auVar28 = *(undefined1 (*) [32])(lVar15 + uVar16 * 0x20);
      }
      sVar10 = bottom_top_blob->cstep;
      pvVar8 = bottom_top_blob->data;
      sVar11 = bottom_top_blob->elemsize;
      pauVar22 = (undefined1 (*) [32])(sVar10 * uVar16 * sVar11 + (long)pvVar8);
      lVar19 = 0;
      for (iVar20 = 0; iVar20 + 7 < iVar13; iVar20 = iVar20 + 8) {
        auVar12 = vfmadd132ps_fma(*pauVar22,auVar26,auVar28);
        *pauVar22 = ZEXT1632(auVar12);
        pauVar22 = pauVar22 + 1;
        lVar19 = lVar19 + 8;
      }
      for (; iVar20 + 3 < iVar13; iVar20 = iVar20 + 4) {
        auVar12 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar22,auVar25,auVar24);
        *(undefined1 (*) [16])*pauVar22 = auVar12;
        pauVar22 = (undefined1 (*) [32])(*pauVar22 + 0x10);
        lVar19 = lVar19 + 4;
      }
      lVar15 = sVar10 * sVar11 * uVar16;
      for (; (int)lVar19 < iVar13; lVar19 = lVar19 + 1) {
        auVar25 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)pvVar8 + lVar19 * 4 + lVar15)),auVar23,
                                  ZEXT416(uVar6));
        *(int *)((long)pvVar8 + lVar19 * 4 + lVar15) = auVar25._0_4_;
      }
    }
  }
  return 0;
}

Assistant:

int BatchNorm_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int c = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;

    if (dims == 1)
    {
        float* ptr = bottom_top_blob;
        const float* aptr = a_data;
        const float* bptr = b_data;

        const int size = w * elempack;

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p512 = _mm512_loadu_ps(ptr);
            __m512 _a512 = _mm512_loadu_ps(aptr);
            __m512 _b512 = _mm512_loadu_ps(bptr);
            _p512 = _mm512_fmadd_ps(_p512, _b512, _a512);
            _mm512_storeu_ps(ptr, _p512);
            ptr += 16;
            aptr += 16;
            bptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p256 = _mm256_loadu_ps(ptr);
            __m256 _a256 = _mm256_loadu_ps(aptr);
            __m256 _b256 = _mm256_loadu_ps(bptr);
            _p256 = _mm256_comp_fmadd_ps(_p256, _b256, _a256);
            _mm256_storeu_ps(ptr, _p256);
            ptr += 8;
            aptr += 8;
            bptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p128 = _mm_loadu_ps(ptr);
            __m128 _a128 = _mm_loadu_ps(aptr);
            __m128 _b128 = _mm_loadu_ps(bptr);
            _p128 = _mm_comp_fmadd_ps(_p128, _b128, _a128);
            _mm_storeu_ps(ptr, _p128);
            ptr += 4;
            aptr += 4;
            bptr += 4;
        }
#endif // __SSE__
        for (; i < size; i++)
        {
            *ptr = *bptr * *ptr + *aptr;
            ptr++;
            aptr++;
            bptr++;
        }
    }

    if (dims == 2)
    {
        const int size = w * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            float a = a_data[i];
            float b = b_data[i];

#if __SSE2__
            __m128 _a128 = (elempack == 4) ? _mm_loadu_ps((const float*)a_data + i * 4) : _mm_set1_ps(a);
            __m128 _b128 = (elempack == 4) ? _mm_loadu_ps((const float*)b_data + i * 4) : _mm_set1_ps(b);
#if __AVX__
            __m256 _a256 = (elempack == 8) ? _mm256_loadu_ps((const float*)a_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_a128), _a128, 1);
            __m256 _b256 = (elempack == 8) ? _mm256_loadu_ps((const float*)b_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b128), _b128, 1);
#if __AVX512F__
            __m512 _a512 = (elempack == 16) ? _mm512_loadu_ps((const float*)a_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_a256), _a256, 1);
            __m512 _b512 = (elempack == 16) ? _mm512_loadu_ps((const float*)b_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b256), _b256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

            int j = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; j + 15 < size; j += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _p512 = _mm512_fmadd_ps(_p512, _b512, _a512);
                _mm512_storeu_ps(ptr, _p512);
                ptr += 16;
            }
#endif // __AVX512F__
            for (; j + 7 < size; j += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _p256 = _mm256_comp_fmadd_ps(_p256, _b256, _a256);
                _mm256_storeu_ps(ptr, _p256);
                ptr += 8;
            }
#endif // __AVX__
            for (; j + 3 < size; j += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _p128 = _mm_comp_fmadd_ps(_p128, _b128, _a128);
                _mm_storeu_ps(ptr, _p128);
                ptr += 4;
            }
#endif // __SSE__
            for (; j < size; j++)
            {
                *ptr = b * *ptr + a;
                ptr++;
            }
        }
    }

    if (dims == 3 || dims == 4)
    {
        const int size = w * h * d * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < c; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float a = a_data[q];
            float b = b_data[q];

#if __SSE2__
            __m128 _a128 = (elempack == 4) ? _mm_loadu_ps((const float*)a_data + q * 4) : _mm_set1_ps(a);
            __m128 _b128 = (elempack == 4) ? _mm_loadu_ps((const float*)b_data + q * 4) : _mm_set1_ps(b);
#if __AVX__
            __m256 _a256 = (elempack == 8) ? _mm256_loadu_ps((const float*)a_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_a128), _a128, 1);
            __m256 _b256 = (elempack == 8) ? _mm256_loadu_ps((const float*)b_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b128), _b128, 1);
#if __AVX512F__
            __m512 _a512 = (elempack == 16) ? _mm512_loadu_ps((const float*)a_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_a256), _a256, 1);
            __m512 _b512 = (elempack == 16) ? _mm512_loadu_ps((const float*)b_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b256), _b256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _p512 = _mm512_fmadd_ps(_p512, _b512, _a512);
                _mm512_storeu_ps(ptr, _p512);
                ptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _p256 = _mm256_comp_fmadd_ps(_p256, _b256, _a256);
                _mm256_storeu_ps(ptr, _p256);
                ptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _p128 = _mm_comp_fmadd_ps(_p128, _b128, _a128);
                _mm_storeu_ps(ptr, _p128);
                ptr += 4;
            }
#endif // __SSE__
            for (; i < size; i++)
            {
                *ptr = b * *ptr + a;
                ptr++;
            }
        }
    }

    return 0;
}